

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

void __thiscall
pbrt::RGBGridMedium::RGBGridMedium
          (RGBGridMedium *this,Bounds3f *bounds,Transform *renderFromMedium,Float g,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *rgbA,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *rgbS,Float sigmaScale,
          optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_> *rgbLe,Float LeScale,
          Allocator alloc)

{
  Point3i res;
  Bounds3f bounds_00;
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  SampledGrid<pbrt::RGBUnboundedSpectrum> *pSVar4;
  undefined1 (*in_RDX) [64];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Float in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined8 in_stack_00000008;
  Float maxSigma_t;
  anon_class_1_0_00000001 max;
  Bounds3f bounds_1;
  int x;
  int y;
  int z;
  undefined8 in_stack_fffffffffffffe58;
  Point3<int> *in_stack_fffffffffffffe60;
  undefined8 uVar7;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *in_stack_fffffffffffffe68;
  undefined8 uVar8;
  MajorantGrid *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Allocator in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  SampledGrid<pbrt::RGBUnboundedSpectrum> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 local_c4 [24];
  int local_ac;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 local_4c;
  undefined4 local_3c;
  Float local_24;
  undefined8 *local_18;
  undefined8 local_8;
  
  local_8 = in_stack_00000008;
  in_RDI[2] = in_RSI[2];
  uVar7 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar7;
  auVar5 = vmovdqu64_avx512f(*in_RDX);
  auVar6 = vmovdqu64_avx512f(in_RDX[1]);
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])(in_RDI + 0xb) = auVar6;
  auVar6 = vmovdqu64_avx512f(auVar5);
  *(undefined1 (*) [64])(in_RDI + 3) = auVar6;
  local_4c = in_XMM2_Da;
  local_3c = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_18 = in_RSI;
  pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_> *)in_stack_fffffffffffffe70,
             (optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_> *)in_stack_fffffffffffffe68)
  ;
  *(undefined4 *)(in_RDI + 0x1a) = local_4c;
  HGPhaseFunction::HGPhaseFunction((HGPhaseFunction *)((long)in_RDI + 0xd4),local_24);
  pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  *(undefined4 *)(in_RDI + 0x29) = local_3c;
  local_68 = local_18[2];
  local_78 = *local_18;
  uStack_70 = local_18[1];
  Point3<int>::Point3(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                      (int)in_stack_fffffffffffffe58,0);
  local_90 = local_8;
  local_98 = local_7c;
  local_a0 = local_84;
  bounds_00.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffeb4;
  bounds_00.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffeb0;
  bounds_00._8_7_ = in_stack_fffffffffffffeb8;
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.x._3_1_ = in_stack_fffffffffffffebf;
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffec0;
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffec4;
  res.super_Tuple3<pbrt::Point3,_int>._4_7_ = in_stack_fffffffffffffea0;
  res.super_Tuple3<pbrt::Point3,_int>.x = in_stack_fffffffffffffe9c;
  res.super_Tuple3<pbrt::Point3,_int>.z._3_1_ = in_stack_fffffffffffffea7;
  uVar7 = uStack_70;
  uVar8 = local_68;
  MajorantGrid::MajorantGrid
            ((MajorantGrid *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),bounds_00
             ,res,in_stack_fffffffffffffe80);
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x13));
  if ((bVar1) &&
     (bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x1b)), !bVar1)) {
    LogFatal<char_const(&)[12]>
              ((LogLevel)in_stack_fffffffffffffec4,
               (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
               (char (*) [12])CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  }
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x1b));
  if (bVar1) {
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x92a709);
    sVar3 = SampledGrid<pbrt::RGBUnboundedSpectrum>::BytesAllocated
                      ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)0x92a720);
    *(long *)(*in_FS_OFFSET + -0xf8) = sVar3 + *(long *)(*in_FS_OFFSET + -0xf8);
  }
  uVar2 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x22));
  if ((bool)uVar2) {
    in_stack_fffffffffffffec8 =
         pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
                   ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x92a780);
    sVar3 = SampledGrid<pbrt::RGBUnboundedSpectrum>::BytesAllocated
                      ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)0x92a791);
    in_stack_fffffffffffffec4 = (float)(sVar3 >> 0x20);
    *(long *)(*in_FS_OFFSET + -0xf8) = sVar3 + *(long *)(*in_FS_OFFSET + -0xf8);
  }
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x13));
  if (bVar1) {
    pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>_> *)0x92a7eb);
    sVar3 = SampledGrid<pbrt::RGBIlluminantSpectrum>::BytesAllocated
                      ((SampledGrid<pbrt::RGBIlluminantSpectrum> *)0x92a7fc);
    *(long *)(*in_FS_OFFSET + -0xf8) = sVar3 + *(long *)(*in_FS_OFFSET + -0xf8);
  }
  for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x32); local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < *(int *)((long)in_RDI + 0x18c); local_a8 = local_a8 + 1) {
      for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x31); local_ac = local_ac + 1) {
        MajorantGrid::VoxelBounds
                  ((MajorantGrid *)CONCAT17(uVar2,in_stack_fffffffffffffed0),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
                   (int)in_stack_fffffffffffffec4);
        bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x1b));
        if (bVar1) {
          pSVar4 = pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
                             ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x92a8fc);
          SampledGrid<pbrt::RGBUnboundedSpectrum>::
          MaxValue<pbrt::RGBGridMedium::RGBGridMedium(pbrt::Bounds3<float>const&,pbrt::Transform_const&,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>>,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
                    (pSVar4,local_c4);
        }
        bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x22));
        if (bVar1) {
          pSVar4 = pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator->
                             ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)0x92a97f);
          SampledGrid<pbrt::RGBUnboundedSpectrum>::
          MaxValue<pbrt::RGBGridMedium::RGBGridMedium(pbrt::Bounds3<float>const&,pbrt::Transform_const&,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>>,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
                    (pSVar4,local_c4);
        }
        MajorantGrid::Set(in_stack_fffffffffffffe70,(int)((ulong)uVar8 >> 0x20),(int)uVar8,
                          (int)((ulong)uVar7 >> 0x20),(Float)uVar7);
      }
    }
  }
  return;
}

Assistant:

RGBGridMedium::RGBGridMedium(const Bounds3f &bounds, const Transform &renderFromMedium,
                             Float g,
                             pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbA,
                             pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbS,
                             Float sigmaScale,
                             pstd::optional<SampledGrid<RGBIlluminantSpectrum>> rgbLe,
                             Float LeScale, Allocator alloc)
    : bounds(bounds),
      renderFromMedium(renderFromMedium),
      phase(g),
      sigma_aGrid(std::move(rgbA)),
      sigma_sGrid(std::move(rgbS)),
      sigmaScale(sigmaScale),
      majorantGrid(bounds, {16, 16, 16}, alloc),
      LeGrid(std::move(rgbLe)),
      LeScale(LeScale) {
    if (LeGrid)
        CHECK(sigma_aGrid);
    if (sigma_aGrid)
        volumeGridBytes += sigma_aGrid->BytesAllocated();
    if (sigma_sGrid)
        volumeGridBytes += sigma_sGrid->BytesAllocated();
    if (LeGrid)
        volumeGridBytes += LeGrid->BytesAllocated();

    // Initialize _majorantGrid_ for _RGBGridMedium_
    for (int z = 0; z < majorantGrid.res.z; ++z)
        for (int y = 0; y < majorantGrid.res.y; ++y)
            for (int x = 0; x < majorantGrid.res.x; ++x) {
                Bounds3f bounds = majorantGrid.VoxelBounds(x, y, z);
                // Initialize _majorantGrid_ voxel for RGB $\sigmaa$ and $\sigmas$
                auto max = [] PBRT_CPU_GPU(RGBUnboundedSpectrum s) {
                    return s.MaxValue();
                };
                Float maxSigma_t =
                    (sigma_aGrid ? sigma_aGrid->MaxValue(bounds, max) : 1) +
                    (sigma_sGrid ? sigma_sGrid->MaxValue(bounds, max) : 1);
                majorantGrid.Set(x, y, z, sigmaScale * maxSigma_t);
            }
}